

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters *pZVar1;
  undefined4 uVar2;
  ZSTD_compressionParameters cPar;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  undefined4 uStack_1c;
  
  if (srcSizeHint == 0xffffffffffffffff && dictSize == 0) {
    uVar8 = 0xffffffffffffffff;
  }
  else {
    lVar11 = 500;
    if (dictSize == 0) {
      lVar11 = 0;
    }
    lVar7 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar7 = lVar11;
    }
    uVar8 = lVar7 + dictSize + srcSizeHint;
  }
  lVar11 = (ulong)(uVar8 < 0x20001) + (ulong)(uVar8 < 0x40001) + (ulong)(uVar8 < 0x4001);
  iVar10 = 3;
  if (compressionLevel != 0) {
    iVar10 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar10 = 0;
  }
  iVar6 = 0x16;
  if (compressionLevel < 0x17) {
    iVar6 = iVar10;
  }
  pZVar1 = ZSTD_defaultCParameters[lVar11] + iVar6;
  uVar2 = pZVar1->searchLog;
  uVar3 = pZVar1->windowLog;
  uVar4 = pZVar1->chainLog;
  uVar5 = pZVar1->hashLog;
  cPar.hashLog = uVar5;
  cPar.chainLog = uVar4;
  cPar.windowLog = uVar3;
  if (compressionLevel < 0) {
    uVar9 = -compressionLevel;
  }
  else {
    uVar9 = ZSTD_defaultCParameters[lVar11][iVar6].targetLength;
  }
  cPar.strategy = ZSTD_defaultCParameters[lVar11][iVar6].strategy;
  cPar.targetLength = uVar9;
  cPar.searchLog = uVar2;
  cPar.minMatch = ZSTD_defaultCParameters[lVar11][iVar6].minMatch;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    int const unknown = srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN;
    size_t const addedSize = unknown && dictSize > 0 ? 500 : 0;
    U64 const rSize = unknown && dictSize == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : srcSizeHint+dictSize+addedSize;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}